

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O2

int __thiscall crnlib::qdxt5::init(qdxt5 *this,EVP_PKEY_CTX *ctx)

{
  mip_desc *pmVar1;
  vec2F_clusterizer *this_00;
  byte bVar2;
  uint uVar3;
  uint32 uVar4;
  uint32 uVar5;
  dxt_pixel_block *pdVar6;
  double dVar7;
  uchar uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  crn_thread_id_t cVar13;
  uchar *puVar14;
  void *in_RCX;
  ulong uVar15;
  ulong uVar16;
  undefined1 *puVar17;
  uint uVar18;
  uint uVar19;
  dxt_pixel_block *in_RDX;
  ulong uVar20;
  uint e;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint l;
  int iVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  color_quad_u8 *pcVar29;
  uint y;
  uint uVar30;
  long lVar31;
  uint uVar32;
  uint x;
  long lVar33;
  uint y_1;
  uint uVar34;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *unaff_R13;
  mip_desc *pmVar35;
  uint *puVar36;
  uint uVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  uint local_654;
  uint local_630;
  int local_62c;
  color_quad_u8 h;
  color_quad_u8 l_1;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5d4;
  vec2F ev;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_5b0;
  uint encoding_hist [8];
  image_u8 debug_img;
  uint c [8];
  color_quad_u8 layout_pixels [64];
  color_quad_u8 chunk_pixels [64];
  hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  selector_hash;
  long local_2c0 [82];
  
  clear(this);
  cVar13 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar13;
  this->m_num_blocks = (uint)ctx;
  this->m_pBlocks = in_RDX;
  memcpy(&this->m_params,in_RCX,0x62d);
  this_00 = &this->m_endpoint_clusterizer;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::reserve
            (&this_00->m_training_vecs,(uint)ctx);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  debug_img.m_width = 0;
  debug_img.m_height = 0;
  debug_img.m_pitch = 0;
  debug_img.m_total = 0;
  debug_img.m_comp_flags = 0xf;
  debug_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  debug_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
  debug_img.m_pixel_buf.m_size = 0;
  debug_img.m_pixel_buf.m_capacity = 0;
  if (((this->m_params).m_hierarchical == true) && ((this->m_params).m_num_mips != 0)) {
    vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::resize
              (&this_00->m_training_vecs,this->m_num_blocks,false);
    encoding_hist[4] = 0;
    encoding_hist[5] = 0;
    encoding_hist[6] = 0;
    encoding_hist[7] = 0;
    encoding_hist[0] = 0;
    encoding_hist[1] = 0;
    encoding_hist[2] = 0;
    encoding_hist[3] = 0;
    pmVar1 = (this->m_params).m_mip_desc;
    local_630 = 0x200;
    local_5b0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&DAT_001ba7f4;
    local_654 = 0;
    for (uVar20 = 0; uVar20 < (this->m_params).m_num_mips; uVar20 = uVar20 + 1) {
      uVar19 = (this->m_params).m_mip_desc[uVar20].m_block_width;
      uVar3 = (this->m_params).m_mip_desc[uVar20].m_block_height;
      uVar21 = uVar19 + 1 >> 1;
      uVar37 = uVar3 + 1 >> 1;
      local_5d4.m_u32 = 0xff000000;
      image<crnlib::color_quad<unsigned_char,_int>_>::resize
                (&debug_img,uVar21 * 8,uVar37 * 8,0xffffffff,
                 (color_quad<unsigned_char,_int> *)&local_5d4.field_0);
      pmVar35 = pmVar1 + uVar20;
      uVar12 = uVar3 * 4 - 1;
      uVar34 = uVar19 * 4 - 1;
      iVar11 = 0;
      local_62c = 0;
      unaff_R13 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)pmVar1;
      for (uVar16 = 0; uVar16 != uVar37; uVar16 = uVar16 + 1) {
        iVar10 = 0;
        iVar9 = 0;
        for (uVar15 = 0; uVar15 != uVar21; uVar15 = uVar15 + 1) {
          uVar19 = pmVar35->m_first_block;
          uVar3 = pmVar35->m_block_width;
          pdVar6 = this->m_pBlocks;
          pcVar29 = chunk_pixels;
          for (lVar31 = 0; lVar31 != 8; lVar31 = lVar31 + 1) {
            uVar32 = (int)uVar16 * 8 | (uint)lVar31;
            if (uVar12 <= uVar32) {
              uVar32 = uVar12;
            }
            for (lVar33 = 0; lVar33 != 8; lVar33 = lVar33 + 1) {
              uVar22 = (int)uVar15 * 8 | (uint)lVar33;
              if (uVar34 <= uVar22) {
                uVar22 = uVar34;
              }
              pcVar29[lVar33].field_0 =
                   *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                    ((long)&pdVar6[(uVar22 >> 2) + (uVar32 >> 2) * uVar3 + uVar19].m_pixels[0]
                            [uVar22 & 3].field_0 + (ulong)((uVar32 & 3) << 4));
            }
            pcVar29 = pcVar29 + 8;
          }
          puVar36 = &selector_hash.m_values.m_size;
          for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
            uVar32 = (&DAT_001baa88)[lVar31 * 5];
            iVar28 = (&DAT_001baa8c)[lVar31 * 5];
            uVar22 = (&DAT_001baa84)[lVar31 * 5] * 8 + (&g_chunk_tile_layouts)[lVar31 * 5];
            uVar18 = 0;
            for (iVar24 = 0; uVar25 = (ulong)uVar32, uVar27 = uVar22, uVar30 = uVar18,
                iVar24 != iVar28; iVar24 = iVar24 + 1) {
              while( true ) {
                bVar38 = uVar25 == 0;
                uVar25 = uVar25 - 1;
                if (bVar38) break;
                layout_pixels[uVar30].field_0 = chunk_pixels[uVar27].field_0;
                uVar30 = uVar30 + 1;
                uVar27 = uVar27 + 1;
              }
              uVar18 = uVar18 + uVar32;
              uVar22 = uVar22 + 8;
            }
            uVar32 = iVar28 * uVar32;
            lVar33 = lVar31 * 0x50;
            dxt_fast::compress_alpha_block
                      (uVar32,layout_pixels,(uint *)((long)&selector_hash + lVar33),
                       (uint *)((long)&selector_hash + lVar33 + 4),
                       (uint8 *)((long)&selector_hash + lVar33 + 8),(this->m_params).m_comp_index);
            dxt5_block::get_block_values
                      (c,*(uint *)((long)&selector_hash + lVar33),
                       *(uint *)((long)&selector_hash + lVar33 + 4));
            lVar33 = 0;
            for (uVar25 = 0; uVar32 != uVar25; uVar25 = uVar25 + 1) {
              iVar28 = (uint)layout_pixels[uVar25].field_0.c[(this->m_params).m_comp_index] -
                       c[*(byte *)((long)puVar36 + uVar25)];
              lVar33 = lVar33 + (ulong)(uint)(iVar28 * iVar28);
            }
            local_2c0[lVar31 * 10] = lVar33;
            puVar36 = puVar36 + 0x14;
          }
          uVar25 = 0;
          dVar41 = -1.0;
          unaff_R13 = local_5b0;
          for (uVar23 = 0; uVar23 != 8; uVar23 = uVar23 + 1) {
            dVar42 = 0.0;
            for (lVar31 = 0; (ulong)(uint)(&g_chunk_encodings)[uVar23 * 0x15] * 0x14 - lVar31 != 0;
                lVar31 = lVar31 + 0x14) {
              dVar42 = dVar42 + ((double)CONCAT44(0x45300000,
                                                  (int)((ulong)local_2c0[(ulong)*(uint *)((long)
                                                  unaff_R13 + lVar31) * 10] >> 0x20)) -
                                1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,
                                                  (int)local_2c0[(ulong)*(uint *)((long)unaff_R13 +
                                                                                 lVar31) * 10]) -
                                4503599627370496.0);
            }
            dVar42 = dVar42 * 0.015625;
            if (dVar42 < 0.0) {
              dVar7 = sqrt(dVar42);
            }
            else {
              dVar7 = SQRT(dVar42);
            }
            dVar43 = 999999.0;
            if ((dVar42 != 0.0) || (NAN(dVar42))) {
              dVar42 = log10(255.0 / dVar7);
              dVar42 = dVar42 * 20.0;
              dVar43 = 500.0;
              if (dVar42 <= 500.0) {
                dVar43 = dVar42;
              }
              dVar43 = (double)(~-(ulong)(dVar42 < 0.0) & (ulong)dVar43);
            }
            fVar40 = 2.4;
            if (uVar20 != 0) {
              fVar39 = powf(3.0,(float)(uVar20 & 0xffffffff));
              fVar40 = 0.25;
              if (0.25 <= 2.4 / fVar39) {
                fVar40 = 2.4 / fVar39;
              }
            }
            dVar43 = dVar43 - (double)(((float)((&g_chunk_encodings)[uVar23 * 0x15] - 1) / 3.0) *
                                       fVar40 + 0.0);
            if (dVar41 < dVar43) {
              uVar25 = uVar23 & 0xffffffff;
              dVar41 = dVar43;
            }
            unaff_R13 = unaff_R13 + 0x15;
          }
          encoding_hist[uVar25] = encoding_hist[uVar25] + 1;
          for (uVar23 = 0; uVar23 < (uint)(&g_chunk_encodings)[uVar25 * 0x15]; uVar23 = uVar23 + 1)
          {
            lVar31 = (ulong)(uint)(&DAT_001ba7f4)[uVar25 * 0x15 + uVar23 * 5] * 0x50;
            dxt5_block::get_block_values
                      (c,*(uint *)((long)&selector_hash + lVar31),
                       *(uint *)((long)&selector_hash + lVar31 + 4));
            unaff_R13 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                        (&DAT_001ba7e4 + uVar25 * 0x15 + uVar23 * 5);
            iVar24 = 0;
            iVar28 = local_62c;
            for (uVar32 = 0; uVar32 < unaff_R13[3].m_u32; uVar32 = uVar32 + 1) {
              uVar4 = unaff_R13[1].m_u32;
              for (uVar22 = 0; uVar22 < unaff_R13[2].m_u32; uVar22 = uVar22 + 1) {
                uVar5 = unaff_R13->m_u32;
                bVar2 = chunk_pixels[iVar24 + uVar4 * 8 + uVar22 + uVar5].field_0.c
                        [(this->m_params).m_comp_index];
                color_quad<unsigned_char,_int>::set
                          (layout_pixels + (unaff_R13[2].m_u32 * uVar32 + uVar22),(uint)bVar2,
                           (uint)bVar2,(uint)bVar2,0xff);
                uVar18 = c[*(byte *)((long)&selector_hash +
                                    (ulong)(unaff_R13[2].m_u32 * uVar32 + uVar22) + lVar31 + 8)];
                uVar27 = uVar18;
                if (0xfe < uVar18) {
                  uVar27 = 0xff;
                }
                uVar30 = uVar5 + iVar9 + uVar22 + debug_img.m_pitch * (uVar4 + iVar28);
                uVar8 = (uchar)uVar27;
                if ((int)uVar18 < 0) {
                  uVar8 = '\0';
                }
                debug_img.m_pPixels[uVar30].field_0.field_0.r = uVar8;
                debug_img.m_pPixels[uVar30].field_0.field_0.g = uVar8;
                debug_img.m_pPixels[uVar30].field_0.field_0.b = uVar8;
                debug_img.m_pPixels[uVar30].field_0.field_0.a = 0xff;
              }
              iVar24 = iVar24 + 8;
              iVar28 = iVar28 + 1;
            }
            dxt_fast::find_representative_colors
                      (unaff_R13[3].m_u32 * unaff_R13[2].m_u32,layout_pixels,&l_1,&h);
            ev.m_s[0] = (float)l_1.field_0._0_1_;
            iVar28 = (uint)l_1.field_0.field_0.r - (uint)h.field_0.field_0.r;
            uVar22 = iVar28 * iVar28;
            uVar32 = uVar22 >> 3;
            if (7 < uVar32) {
              uVar32 = 8;
            }
            if (uVar22 < 8) {
              uVar32 = 1;
            }
            ev.m_s[1] = (float)h.field_0._0_1_;
            iVar28 = iVar11;
            for (uVar22 = 0; uVar22 < unaff_R13[3].m_u32 >> 2; uVar22 = uVar22 + 1) {
              uVar18 = unaff_R13[1].m_u32;
              if ((int)uVar16 * 2 + uVar22 + (uVar18 >> 2) < pmVar35->m_block_height) {
                iVar24 = iVar10;
                for (uVar27 = 0; uVar27 < unaff_R13[2].m_u32 >> 2; uVar27 = uVar27 + 1) {
                  if (pmVar35->m_block_width <= iVar24 + (unaff_R13->m_u32 >> 2)) break;
                  uVar30 = pmVar35->m_block_width * ((uVar18 >> 2) + iVar28) + iVar24 +
                           (unaff_R13->m_u32 >> 2) + pmVar35->m_first_block;
                  vec<2U,_float>::operator=(&(this_00->m_training_vecs).m_p[uVar30].first,&ev);
                  (this_00->m_training_vecs).m_p[uVar30].second = uVar32;
                  iVar24 = iVar24 + 1;
                }
                local_654 = local_654 + uVar27;
              }
              iVar28 = iVar28 + 1;
            }
          }
          if (local_630 <= local_654) {
            bVar38 = update_progress(this,local_654,this->m_num_blocks - 1);
            if (!bVar38) goto LAB_00131105;
            local_630 = local_630 + 0x200;
          }
          iVar9 = iVar9 + 8;
          iVar10 = iVar10 + 2;
        }
        local_62c = local_62c + 8;
        iVar11 = iVar11 + 2;
      }
    }
  }
  else {
    lVar31 = 0;
    unaff_R13 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)encoding_hist;
    for (uVar20 = 0; uVar20 < this->m_num_blocks; uVar20 = uVar20 + 1) {
      if (((uVar20 & 0x1ff) == 0) &&
         (bVar38 = update_progress(this,(uint)uVar20,this->m_num_blocks - 1), !bVar38))
      goto LAB_00131105;
      puVar14 = this->m_pBlocks->m_pixels[0][0].field_0.c +
                (ulong)(this->m_params).m_comp_index + lVar31;
      puVar17 = (undefined1 *)((long)&selector_hash.m_values.m_p + 3);
      for (lVar33 = 0; lVar33 != 4; lVar33 = lVar33 + 1) {
        for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
          uVar8 = puVar14[lVar26 * 4];
          puVar17[lVar26 * 4 + -3] = uVar8;
          puVar17[lVar26 * 4 + -2] = uVar8;
          puVar17[lVar26 * 4 + -1] = uVar8;
          puVar17[lVar26 * 4] = 0xff;
        }
        puVar17 = puVar17 + 0x10;
        puVar14 = puVar14 + 0x10;
      }
      dxt_fast::find_representative_colors
                (0x10,(color_quad_u8 *)&selector_hash,layout_pixels,
                 (color_quad_u8 *)&unaff_R13->field_0);
      chunk_pixels[0].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           (float)(byte)layout_pixels[0].field_0._0_1_;
      iVar11 = (uint)(byte)layout_pixels[0].field_0._0_1_ - (uint)(byte)encoding_hist[0];
      uVar12 = iVar11 * iVar11;
      uVar19 = uVar12 >> 3;
      if (7 < uVar19) {
        uVar19 = 8;
      }
      if (uVar12 < 8) {
        uVar19 = 1;
      }
      chunk_pixels[1].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           (float)(byte)encoding_hist[0];
      clusterizer<crnlib::vec<2U,_float>_>::add_training_vec
                (this_00,(vec<2U,_float> *)chunk_pixels,uVar19);
      lVar31 = lVar31 + 0x40;
    }
  }
  this->m_progress_start = 0x4b;
  this->m_progress_range = 0x14;
  bVar38 = clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
                     (this_00,0xffff,generate_codebook_progress_callback,this,false);
  if (bVar38) {
    selector_hash.m_values.m_p = (raw_node *)0x0;
    selector_hash.m_values.m_size = 0;
    selector_hash.m_values.m_capacity = 0;
    selector_hash.m_hash_shift = 0x20;
    selector_hash.m_num_valid = 0;
    selector_hash.m_grow_threshold = 0;
    this->m_progress_start = 0x5f;
    this->m_progress_range = 5;
    uVar20 = 0;
    while( true ) {
      bVar38 = this->m_num_blocks <= uVar20;
      unaff_R13 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                  CONCAT71((int7)((ulong)unaff_R13 >> 8),bVar38);
      iVar11 = (int)unaff_R13;
      if (bVar38) break;
      if (((uVar20 & 0x1ff) == 0) &&
         (bVar38 = update_progress(this,(uint)uVar20,this->m_num_blocks - 1), !bVar38))
      goto LAB_00131127;
      dxt_fast::compress_alpha_block
                ((dxt5_block *)layout_pixels,(color_quad_u8 *)(this->m_pBlocks + uVar20),
                 (this->m_params).m_comp_index);
      puVar14 = &layout_pixels[0].field_0.field_0.b;
      encoding_hist._0_8_ = 0;
      for (lVar31 = 0; lVar31 != 0x30; lVar31 = lVar31 + 8) {
        encoding_hist._0_8_ = encoding_hist._0_8_ | (ulong)*puVar14 << ((byte)lVar31 & 0x3f);
        puVar14 = puVar14 + 1;
      }
      hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
      ::insert((insert_result *)chunk_pixels,&selector_hash,(unsigned_long_long *)encoding_hist,
               (empty_type *)c);
      uVar20 = uVar20 + 1;
    }
    this->m_max_selector_clusters = selector_hash.m_num_valid + 0x80;
    update_progress(this,1,1);
LAB_00131127:
    hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
    ::~hash_map(&selector_hash);
  }
  else {
LAB_00131105:
    iVar11 = 0;
  }
  vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&debug_img.m_pixel_buf);
  return iVar11;
}

Assistant:

bool qdxt5::init(uint n, const dxt_pixel_block* pBlocks, const qdxt5_params& params)
    {
        clear();

        CRNLIB_ASSERT(n && pBlocks);

        m_main_thread_id = crn_get_current_thread_id();

        m_num_blocks = n;
        m_pBlocks = pBlocks;
        m_params = params;

        m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

        m_progress_start = 0;
        m_progress_range = 75;

        image_u8 debug_img;

        const bool debugging = true;

        if ((m_params.m_hierarchical) && (m_params.m_num_mips))
        {
            vec2F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
            training_vecs.resize(m_num_blocks);

            uint encoding_hist[cNumChunkEncodings];
            utils::zero_object(encoding_hist);

            uint total_processed_blocks = 0;
            uint next_progress_threshold = 512;

            for (uint level = 0; level < m_params.m_num_mips; level++)
            {
                const qdxt5_params::mip_desc& level_desc = m_params.m_mip_desc[level];

                const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
                const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

                const uint level_width = level_desc.m_block_width * 4;
                const uint level_height = level_desc.m_block_height * 4;

                if (debugging)
                {
                    debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);
                }

                for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++)
                {
                    for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++)
                    {
                        color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

                        for (uint y = 0; y < cChunkPixelHeight; y++)
                        {
                            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

                            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

                            for (uint x = 0; x < cChunkPixelWidth; x++)
                            {
                                const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

                                const uint block_index = outer_block_index + (pix_x >> 2);

                                const dxt_pixel_block& block = m_pBlocks[block_index];

                                const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

                                chunk_pixels[x + y * 8] = p;
                            }
                        }

                        struct layout_results
                        {
                            uint m_low_color;
                            uint m_high_color;
                            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
                            uint64 m_error;
                            //float m_penalty;
                        };
                        layout_results layouts[cNumChunkTileLayouts];

                        for (uint l = 0; l < cNumChunkTileLayouts; l++)
                        {
                            const uint width = g_chunk_tile_layouts[l].m_width;
                            const uint height = g_chunk_tile_layouts[l].m_height;
                            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
                            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

                            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
                            for (uint y = 0; y < height; y++)
                            {
                                for (uint x = 0; x < width; x++)
                                {
                                    layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];
                                }
                            }

                            const uint n = width * height;
                            dxt_fast::compress_alpha_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors, m_params.m_comp_index);

                            uint c[dxt5_block::cMaxSelectorValues];
                            dxt5_block::get_block_values(c, layouts[l].m_low_color, layouts[l].m_high_color);

                            uint64 error = 0;
                            for (uint i = 0; i < n; i++)
                            {
                                error += math::square((int)layout_pixels[i][m_params.m_comp_index] - (int)c[layouts[l].m_selectors[i]]);
                            }

                            layouts[l].m_error = error;
                        }

                        double best_peak_snr = -1.0f;
                        uint best_encoding = 0;

                        for (uint e = 0; e < cNumChunkEncodings; e++)
                        {
                            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

                            double total_error = 0;

                            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            {
                                total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;
                            }

                            double mean_squared = total_error * (1.0f / 64.0f);
                            double root_mean_squared = sqrt(mean_squared);

                            double peak_snr = 999999.0f;
                            if (mean_squared)
                            {
                                peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);
                            }

                            float adaptive_tile_alpha_psnr_derating = 2.4f;
                            //if (level)
                            //   adaptive_tile_alpha_psnr_derating = math::lerp(adaptive_tile_alpha_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));
                            if ((level) && (adaptive_tile_alpha_psnr_derating > .25f))
                            {
                                adaptive_tile_alpha_psnr_derating = math::maximum(.25f, adaptive_tile_alpha_psnr_derating / powf(3.0f, static_cast<float>(level)));
                            }

                            float alpha_derating = math::lerp(0.0f, adaptive_tile_alpha_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
                            peak_snr = peak_snr - alpha_derating;

                            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

                            if (peak_snr > best_peak_snr)
                            {
                                best_peak_snr = peak_snr;
                                best_encoding = e;
                            }
                        }

                        encoding_hist[best_encoding]++;

                        const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

                        for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                        {
                            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

                            uint layout_index = tile_desc.m_layout_index;
                            const layout_results& layout = layouts[layout_index];

                            uint c[dxt5_block::cMaxSelectorValues];
                            if (debugging)
                            {
                                dxt5_block::get_block_values(c, layout.m_low_color, layout.m_high_color);
                            }

                            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

                            for (uint y = 0; y < tile_desc.m_height; y++)
                            {
                                const uint pix_y = y + tile_desc.m_y_ofs;

                                for (uint x = 0; x < tile_desc.m_width; x++)
                                {
                                    const uint pix_x = x + tile_desc.m_x_ofs;

                                    uint a = chunk_pixels[pix_x + pix_y * cChunkPixelWidth][m_params.m_comp_index];

                                    tile_pixels[x + y * tile_desc.m_width].set(a, a, a, 255);

                                    if (debugging)
                                    {
                                        debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
                                    }
                                }
                            }

                            color_quad_u8 l, h;
                            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

                            const uint dist = math::square<int>((int)l[0] - (int)h[0]);

                            const int cAlphaErrorToWeight = 8;
                            const uint cMaxWeight = 8;
                            uint weight = math::clamp<uint>(dist / cAlphaErrorToWeight, 1, cMaxWeight);

                            vec2F ev;

                            ev[0] = l[0];
                            ev[1] = h[0];

                            for (uint y = 0; y < (tile_desc.m_height >> 2); y++)
                            {
                                uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
                                if (block_y >= level_desc.m_block_height)
                                {
                                    continue;
                                }

                                for (uint x = 0; x < (tile_desc.m_width >> 2); x++)
                                {
                                    uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                                    if (block_x >= level_desc.m_block_width)
                                    {
                                        break;
                                    }

                                    uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                                    training_vecs[block_index].first = ev;
                                    training_vecs[block_index].second = weight;

                                    total_processed_blocks++;

                                } // x
                            } // y
                        } //t

                        if (total_processed_blocks >= next_progress_threshold)
                        {
                            next_progress_threshold += 512;

                            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
                            {
                                return false;
                            }
                        }

                    } // chunk_x
                } // chunk_y

#if QDXT5_DEBUGGING
                if (debugging)
                    image_utils::write_to_file(dynamic_wstring(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

            } // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
        }
        else
        {
            for (uint block_index = 0; block_index < m_num_blocks; block_index++)
            {
                if ((block_index & 511) == 0)
                {
                    if (!update_progress(block_index, m_num_blocks - 1))
                    {
                        return false;
                    }
                }

                color_quad_u8 c[16];
                for (uint y = 0; y < cDXTBlockSize; y++)
                {
                    for (uint x = 0; x < cDXTBlockSize; x++)
                    {
                        c[x + y * cDXTBlockSize].set(m_pBlocks[block_index].m_pixels[y][x][m_params.m_comp_index], 255);
                    }
                }

                color_quad_u8 l, h;
                dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, c, l, h);

                const uint dist = math::square<int>((int)l[0] - (int)h[0]);

                const int cAlphaErrorToWeight = 8;
                const uint cMaxWeight = 8;
                uint weight = math::clamp<uint>(dist / cAlphaErrorToWeight, 1, cMaxWeight);

                vec2F ev;

                ev[0] = l[0];
                ev[1] = h[0];

                m_endpoint_clusterizer.add_training_vec(ev, weight);
            }
        }

        const uint cMaxEndpointClusters = 65535U;

        m_progress_start = 75;
        m_progress_range = 20;

        if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
        {
            return false;
        }

        crnlib::hash_map<uint64, empty_type> selector_hash;

        m_progress_start = 95;
        m_progress_range = 5;

        for (uint block_index = 0; block_index < m_num_blocks; block_index++)
        {
            if ((block_index & 511) == 0)
            {
                if (!update_progress(block_index, m_num_blocks - 1))
                {
                    return false;
                }
            }

            dxt5_block dxt_blk;
            dxt_fast::compress_alpha_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0], m_params.m_comp_index);

            uint64 selectors = 0;
            for (uint i = 0; i < dxt5_block::cNumSelectorBytes; i++)
            {
                selectors |= static_cast<uint64>(dxt_blk.m_selectors[i]) << (i * 8U);
            }

            selector_hash.insert(selectors);
        }

        m_max_selector_clusters = selector_hash.size() + 128;

        update_progress(1, 1);

        return true;
    }